

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::TimeCoordinator::updateTimeFactors(TimeCoordinator *this)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> *this_00;
  size_type sVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  TimeRepresentation<count_time<9,_long>_> TVar4;
  Time TVar5;
  long in_RDI;
  Time prev_next;
  bool update;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 local_139;
  undefined1 local_121;
  undefined8 in_stack_fffffffffffffee0;
  TimeDependencies *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  TimeDependencies *in_stack_fffffffffffffef8;
  Time in_stack_ffffffffffffff00;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff08;
  TimeRepresentation<count_time<9,_long>_> local_d8;
  undefined7 in_stack_ffffffffffffff30;
  byte bVar6;
  GlobalFederateId local_ac;
  undefined4 local_a8;
  GlobalFederateId local_a4;
  undefined1 local_a0 [72];
  undefined4 local_58;
  GlobalFederateId local_54;
  undefined1 local_50 [80];
  
  local_121 = 1;
  if ((*(byte *)(in_RDI + 0x252) & 1) == 0) {
    local_121 = *(undefined1 *)(in_RDI + 0x25e);
  }
  memset(&local_54,0,4);
  GlobalFederateId::GlobalFederateId(&local_54);
  local_58 = 0x8831d580;
  generateMinTimeTotal
            (in_stack_fffffffffffffee8,SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),
             (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffef0 >> 0x20),
             (GlobalFederateId)(BaseType)in_stack_fffffffffffffef0,
             (int32_t)in_stack_fffffffffffffee0);
  memcpy((void *)(in_RDI + 0xa0),local_50,0x48);
  this_00 = (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8);
  local_139 = 1;
  if ((*(byte *)(in_RDI + 0x252) & 1) == 0) {
    local_139 = *(undefined1 *)(in_RDI + 0x25e);
  }
  memset(&local_a4,0,4);
  GlobalFederateId::GlobalFederateId(&local_a4);
  local_a8 = 0x8831d580;
  generateMinTimeUpstream
            (in_stack_fffffffffffffef8,SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),
             (GlobalFederateId)(BaseType)((ulong)in_stack_ffffffffffffff00.internalTimeCode >> 0x20)
             ,(GlobalFederateId)(BaseType)in_stack_ffffffffffffff00.internalTimeCode,
             (int32_t)in_stack_fffffffffffffef0);
  memcpy((void *)(in_RDI + 0x58),local_a0,0x48);
  if (((*(byte *)(in_RDI + 0x25e) & 1) != 0) &&
     (sVar2 = TimeDependencies::size((TimeDependencies *)0x55677e), sVar2 == 1)) {
    memcpy((void *)(in_RDI + 0x58),(void *)(in_RDI + 0xa0),0x48);
    memset(&local_ac,0,4);
    GlobalFederateId::GlobalFederateId(&local_ac);
    *(BaseType *)(in_RDI + 0x80) = local_ac.gid;
  }
  TimeRepresentation<count_time<9,_long>_>::maxVal();
  TVar3 = TimeRepresentation<count_time<9,_long>_>::operator-
                    (this_00,(TimeRepresentation<count_time<9,_long>_> *)
                             CONCAT17(local_121,CONCAT16(local_139,in_stack_fffffffffffffeb0)));
  std::max<TimeRepresentation<count_time<9,long>>>
            (in_stack_fffffffffffffea8,(TimeRepresentation<count_time<9,_long>_> *)0x556825);
  TVar4 = TimeRepresentation<count_time<9,_long>_>::operator-
                    (this_00,(TimeRepresentation<count_time<9,_long>_> *)
                             CONCAT17(local_121,CONCAT16(local_139,in_stack_fffffffffffffeb0)));
  *(baseType *)(in_RDI + 0x188) = TVar4.internalTimeCode;
  bVar6 = 0;
  *(undefined8 *)(in_RDI + 0x148) = *(undefined8 *)(in_RDI + 0xb0);
  local_d8.internalTimeCode = *(baseType *)(in_RDI + 0x140);
  updateNextPossibleEventTime((TimeCoordinator *)TVar3.internalTimeCode);
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    (&local_d8,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x140));
  if (bVar1) {
    bVar6 = 1;
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xb0),
                     (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x188));
  if (bVar1) {
    generateAllowedTime((TimeCoordinator *)in_stack_ffffffffffffff00.internalTimeCode,
                        (Time)in_stack_ffffffffffffff08.internalTimeCode);
    TVar3 = TimeRepresentation<count_time<9,_long>_>::operator+
                      (this_00,(TimeRepresentation<count_time<9,_long>_> *)
                               CONCAT17(local_121,CONCAT16(local_139,in_stack_fffffffffffffeb0)));
    *(baseType *)(in_RDI + 0xb0) = TVar3.internalTimeCode;
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x68),
                     (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x188));
  if ((bVar1) &&
     (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x68),
                         (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xb0)), bVar1)) {
    in_stack_ffffffffffffff00 =
         generateAllowedTime(in_stack_ffffffffffffff00.internalTimeCode,
                             in_stack_ffffffffffffff08.internalTimeCode);
    in_stack_ffffffffffffff08 =
         TimeRepresentation<count_time<9,_long>_>::operator+
                   (this_00,(TimeRepresentation<count_time<9,_long>_> *)
                            CONCAT17(local_121,CONCAT16(local_139,in_stack_fffffffffffffeb0)));
    *(baseType *)(in_RDI + 0x68) = in_stack_ffffffffffffff08.internalTimeCode;
  }
  if (((*(byte *)(in_RDI + 0x25e) & 1) == 0) &&
     ((((*(byte *)(in_RDI + 0x253) & 1) != 0 ||
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                          ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x138),
                           (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)) &&
      (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x60),
                          (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x188)), bVar1)))) {
    TVar5 = generateAllowedTime(in_stack_ffffffffffffff00.internalTimeCode,
                                in_stack_ffffffffffffff08.internalTimeCode);
    *(baseType *)(in_RDI + 0x60) = TVar5.internalTimeCode;
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xb0),
                     (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x150));
  if (bVar1) {
    bVar6 = 1;
    *(undefined8 *)(in_RDI + 0x150) = *(undefined8 *)(in_RDI + 0xb0);
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xa0),
                     (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x188));
  if (bVar1) {
    TVar3 = TimeRepresentation<count_time<9,_long>_>::operator+
                      (this_00,(TimeRepresentation<count_time<9,_long>_> *)
                               CONCAT17(local_121,CONCAT16(local_139,in_stack_fffffffffffffeb0)));
  }
  else {
    TVar3 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  *(baseType *)(in_RDI + 0x158) = TVar3.internalTimeCode;
  updateNextExecutionTime((TimeCoordinator *)CONCAT17(bVar6,in_stack_ffffffffffffff30));
  return (bool)(bVar6 & 1);
}

Assistant:

bool TimeCoordinator::updateTimeFactors()
{
    total = generateMinTimeTotal(dependencies,
                                 info.restrictive_time_policy || globalTime,
                                 GlobalFederateId{},
                                 NoIgnoredFederates,
                                 sequenceCounter);
    upstream = generateMinTimeUpstream(dependencies,
                                       info.restrictive_time_policy || globalTime,
                                       GlobalFederateId{},
                                       NoIgnoredFederates,
                                       sequenceCounter);
    if (globalTime && dependencies.size() == 1) {
        upstream = total;
        upstream.minFed = GlobalFederateId{};
    }

    maxTime = Time::maxVal() - info.outputDelay - (std::max)(info.period, info.timeDelta);
    bool update = false;
    time_minminDe = total.minDe;
    Time prev_next = time_next;
    updateNextPossibleEventTime();

    //    printf("%d UPDATE next=%f, minminDE=%f, Tdemin=%f\n", source_id,
    //    static_cast<double>(time_next),
    // static_cast<double>(minminDe), static_cast<double>(minDe));
    if (prev_next != time_next) {
        update = true;
    }
    if (total.minDe < maxTime) {
        total.minDe = generateAllowedTime(total.minDe) + info.outputDelay;
    }
    if (upstream.minDe < maxTime && upstream.minDe > total.minDe) {
        upstream.minDe = generateAllowedTime(upstream.minDe) + info.outputDelay;
    }
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        if (upstream.Te < maxTime) {
            upstream.Te = generateAllowedTime(upstream.minDe);
        }
    }
    if (total.minDe != time_minDe) {
        update = true;
        time_minDe = total.minDe;
    }
    time_allow = (total.next < maxTime) ? info.inputDelay + total.next : Time::maxVal();

    updateNextExecutionTime();
    return update;
}